

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result wabt::interp::Table::Copy
                 (Store *store,Table *dst,u32 dst_offset,Table *src,u32 src_offset,u32 size)

{
  int iVar1;
  int iVar2;
  pointer pRVar3;
  pointer pRVar4;
  ulong uVar5;
  ulong uVar6;
  
  pRVar3 = (dst->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(dst->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pRVar3 >> 3;
  uVar5 = (ulong)size;
  if (uVar6 - uVar5 < (ulong)dst_offset || uVar6 < uVar5) {
    return (Result)Error;
  }
  pRVar4 = (src->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(src->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pRVar4 >> 3;
  if ((ulong)src_offset <= uVar6 - uVar5 && uVar5 <= uVar6) {
    iVar1 = *(int *)&(dst->type_).super_ExternType.field_0xc;
    iVar2 = *(int *)&(src->type_).super_ExternType.field_0xc;
    if (iVar1 != iVar2) {
      switch(iVar1) {
      case -0x17:
      case -0x16:
      case -0x15:
      case -0x14:
      case -0x13:
        return (Result)Error;
      case -0x11:
        break;
      default:
        if (iVar1 != 2) {
          return (Result)Error;
        }
      case -0x18:
      case -0x12:
      case -0x10:
        if (iVar2 != -0x12) {
          return (Result)Error;
        }
      }
    }
    if (size != 0) {
      memmove(pRVar3 + dst_offset,pRVar4 + src_offset,uVar5 << 3);
    }
    return (Result)Ok;
  }
  return (Result)Error;
}

Assistant:

Result Table::Copy(Store& store,
                   Table& dst,
                   u32 dst_offset,
                   const Table& src,
                   u32 src_offset,
                   u32 size) {
  if (dst.IsValidRange(dst_offset, size) &&
      src.IsValidRange(src_offset, size) &&
      TypesMatch(dst.type_.element, src.type_.element)) {
    auto src_begin = src.elements_.begin() + src_offset;
    auto src_end = src_begin + size;
    auto dst_begin = dst.elements_.begin() + dst_offset;
    auto dst_end = dst_begin + size;
    if (dst.self() == src.self() && src_begin < dst_begin) {
      std::move_backward(src_begin, src_end, dst_end);
    } else {
      std::move(src_begin, src_end, dst_begin);
    }
    return Result::Ok;
  }
  return Result::Error;
}